

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

void convert_samples_short
               (int buf_c,short **buffer,int b_offset,int data_c,float **data,int d_offset,
               int samples)

{
  uint uVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  short *psVar10;
  int iVar11;
  float fVar12;
  ulong local_e0;
  float local_b8 [34];
  
  if (((data_c < 7) && (buf_c < 3)) && (buf_c != data_c)) {
    if (0 < buf_c) {
      local_e0 = 0;
      do {
        if (0 < samples) {
          psVar10 = buffer[local_e0] + b_offset;
          uVar1 = convert_samples_short::channel_selector[(uint)buf_c][local_e0];
          iVar3 = 0x20;
          iVar11 = 0;
          uVar6 = 0;
          lVar8 = (long)d_offset << 2;
          do {
            iVar7 = iVar3 + (int)uVar6;
            iVar4 = samples - (int)uVar6;
            if (iVar7 <= samples) {
              iVar4 = iVar3;
            }
            iVar3 = iVar4;
            local_b8[0x1c] = 0.0;
            local_b8[0x1d] = 0.0;
            local_b8[0x1e] = 0.0;
            local_b8[0x1f] = 0.0;
            local_b8[0x18] = 0.0;
            local_b8[0x19] = 0.0;
            local_b8[0x1a] = 0.0;
            local_b8[0x1b] = 0.0;
            local_b8[0x14] = 0.0;
            local_b8[0x15] = 0.0;
            local_b8[0x16] = 0.0;
            local_b8[0x17] = 0.0;
            local_b8[0x10] = 0.0;
            local_b8[0x11] = 0.0;
            local_b8[0x12] = 0.0;
            local_b8[0x13] = 0.0;
            local_b8[0xc] = 0.0;
            local_b8[0xd] = 0.0;
            local_b8[0xe] = 0.0;
            local_b8[0xf] = 0.0;
            local_b8[8] = 0.0;
            local_b8[9] = 0.0;
            local_b8[10] = 0.0;
            local_b8[0xb] = 0.0;
            local_b8[4] = 0.0;
            local_b8[5] = 0.0;
            local_b8[6] = 0.0;
            local_b8[7] = 0.0;
            local_b8[0] = 0.0;
            local_b8[1] = 0.0;
            local_b8[2] = 0.0;
            local_b8[3] = 0.0;
            if (0 < data_c) {
              iVar4 = iVar7;
              if (samples < iVar7) {
                iVar4 = samples;
              }
              uVar9 = 0;
              do {
                if (((uVar1 & (int)channel_position[data_c][uVar9]) != 0) && (0 < iVar3)) {
                  pfVar2 = data[uVar9];
                  lVar5 = 0;
                  do {
                    local_b8[lVar5] = *(float *)((long)pfVar2 + lVar5 * 4 + lVar8) + local_b8[lVar5]
                    ;
                    lVar5 = lVar5 + 1;
                  } while (iVar4 + iVar11 != lVar5);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != (uint)data_c);
            }
            if (0 < iVar3) {
              if (samples < iVar7) {
                iVar7 = samples;
              }
              uVar9 = 0;
              do {
                fVar12 = local_b8[uVar9] + 384.0;
                if ((int)fVar12 < 0x43bf8001) {
                  fVar12 = 383.0;
                }
                if (0x43c07ffe < (int)fVar12) {
                  fVar12 = 384.99997;
                }
                psVar10[uVar9] = SUB42(fVar12,0);
                uVar9 = uVar9 + 1;
              } while ((uint)(iVar7 + iVar11) != uVar9);
            }
            uVar6 = uVar6 + 0x20;
            iVar11 = iVar11 + -0x20;
            lVar8 = lVar8 + 0x80;
            psVar10 = psVar10 + 0x20;
          } while (uVar6 < (uint)samples);
        }
        local_e0 = local_e0 + 1;
      } while (local_e0 != (uint)buf_c);
    }
  }
  else {
    if (buf_c < data_c) {
      data_c = buf_c;
    }
    if (data_c < 1) {
      data_c = 0;
    }
    else {
      uVar6 = 0;
      do {
        if (0 < samples) {
          psVar10 = buffer[uVar6];
          pfVar2 = data[uVar6];
          uVar9 = 0;
          do {
            fVar12 = pfVar2[(long)d_offset + uVar9] + 384.0;
            if ((int)fVar12 < 0x43bf8001) {
              fVar12 = 383.0;
            }
            if (0x43c07ffe < (int)fVar12) {
              fVar12 = 384.99997;
            }
            psVar10[(long)b_offset + uVar9] = SUB42(fVar12,0);
            uVar9 = uVar9 + 1;
          } while ((uint)samples != uVar9);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)data_c);
    }
    if (data_c < buf_c) {
      uVar6 = (ulong)(uint)data_c;
      do {
        memset(buffer[uVar6] + b_offset,0,(long)samples * 2);
        uVar6 = uVar6 + 1;
      } while ((uint)buf_c != uVar6);
    }
  }
  return;
}

Assistant:

static void convert_samples_short(int buf_c, short **buffer, int b_offset, int data_c, float **data, int d_offset, int samples)
{
   int i;
   if (buf_c != data_c && buf_c <= 2 && data_c <= 6) {
      static int channel_selector[3][2] = { {0}, {PLAYBACK_MONO}, {PLAYBACK_LEFT, PLAYBACK_RIGHT} };
      for (i=0; i < buf_c; ++i)
         compute_samples(channel_selector[buf_c][i], buffer[i]+b_offset, data_c, data, d_offset, samples);
   } else {
      int limit = buf_c < data_c ? buf_c : data_c;
      for (i=0; i < limit; ++i)
         copy_samples(buffer[i]+b_offset, data[i]+d_offset, samples);
      for (   ; i < buf_c; ++i)
         memset(buffer[i]+b_offset, 0, sizeof(short) * samples);
   }
}